

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

ConditionalDirectiveExpressionSyntax * __thiscall
slang::parsing::Preprocessor::parseConditionalExpr(Preprocessor *this)

{
  bool bVar1;
  anon_class_8_1_8991fb9c *in_RDI;
  Token TVar2;
  ConditionalDirectiveExpressionSyntax *right;
  Token op_1;
  ConditionalDirectiveExpressionSyntax *operand;
  Token op;
  ConditionalDirectiveExpressionSyntax *left;
  anon_class_8_1_8991fb9c parsePrimary;
  anon_class_1_0_00000001 isBinaryOp;
  Token in_stack_ffffffffffffffa8;
  Preprocessor *this_00;
  undefined1 in_stack_ffffffffffffffb8 [16];
  BinaryConditionalDirectiveExpressionSyntax *local_20;
  undefined7 in_stack_fffffffffffffff0;
  anon_class_1_0_00000001 aVar3;
  
  aVar3 = (anon_class_1_0_00000001)0x0;
  bVar1 = peek((Preprocessor *)in_stack_ffffffffffffffa8.info,in_stack_ffffffffffffffa8.rawLen._2_2_
              );
  if (bVar1) {
    consume((Preprocessor *)in_stack_ffffffffffffffa8.info);
    parseConditionalExpr::anon_class_8_1_8991fb9c::operator()(in_RDI);
    local_20 = (BinaryConditionalDirectiveExpressionSyntax *)
               BumpAllocator::
               emplace<slang::syntax::UnaryConditionalDirectiveExpressionSyntax,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&>
                         (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_,
                          (ConditionalDirectiveExpressionSyntax *)in_stack_ffffffffffffffa8.info);
  }
  else {
    local_20 = (BinaryConditionalDirectiveExpressionSyntax *)
               parseConditionalExpr::anon_class_8_1_8991fb9c::operator()(in_RDI);
  }
  while( true ) {
    this_00 = (Preprocessor *)in_stack_ffffffffffffffa8.info;
    TVar2 = peek(in_stack_ffffffffffffffa8._0_8_);
    bVar1 = parseConditionalExpr::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&stack0xfffffffffffffff7,TVar2.kind);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    in_stack_ffffffffffffffa8 = consume(this_00);
    parseConditionalExpr((Preprocessor *)CONCAT17(aVar3,in_stack_fffffffffffffff0));
    local_20 = BumpAllocator::
               emplace<slang::syntax::BinaryConditionalDirectiveExpressionSyntax,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&>
                         ((BumpAllocator *)TVar2.info,TVar2._0_8_,
                          (Token *)in_stack_ffffffffffffffa8.info,in_stack_ffffffffffffffa8._0_8_);
  }
  return &local_20->super_ConditionalDirectiveExpressionSyntax;
}

Assistant:

ConditionalDirectiveExpressionSyntax* Preprocessor::parseConditionalExpr() {
    auto isBinaryOp = [](TokenKind kind) {
        switch (kind) {
            case TokenKind::DoubleAnd:
            case TokenKind::DoubleOr:
            case TokenKind::MinusArrow:
            case TokenKind::LessThanMinusArrow:
                return true;
            default:
                return false;
        }
    };

    auto parsePrimary = [&]() -> ConditionalDirectiveExpressionSyntax* {
        Token token = peek();
        if (token.kind == TokenKind::OpenParenthesis) {
            auto openParen = consume();
            auto operand = parseConditionalExpr();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            return alloc.emplace<ParenthesizedConditionalDirectiveExpressionSyntax>(openParen,
                                                                                    *operand,
                                                                                    closeParen);
        }
        else {
            auto id = expect(TokenKind::Identifier);
            return alloc.emplace<NamedConditionalDirectiveExpressionSyntax>(id);
        }
    };

    ConditionalDirectiveExpressionSyntax* left;
    if (peek(TokenKind::Exclamation)) {
        auto op = consume();
        auto operand = parsePrimary();
        left = alloc.emplace<UnaryConditionalDirectiveExpressionSyntax>(op, *operand);
    }
    else {
        left = parsePrimary();
    }

    while (true) {
        if (!isBinaryOp(peek().kind))
            break;

        auto op = consume();
        auto right = parseConditionalExpr();
        left = alloc.emplace<BinaryConditionalDirectiveExpressionSyntax>(*left, op, *right);
    }

    return left;
}